

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * capnp::_::WireHelpers::allocate
                 (WirePointer **ref,SegmentBuilder **segment,CapTableBuilder *capTable,
                 SegmentWordCount amount,Kind kind,BuilderArena *orphanArena)

{
  WirePointer *pWVar1;
  bool bVar2;
  uint amount_00;
  SegmentWordCount pos;
  SegmentId si;
  BuilderArena *this;
  AllocateResult AVar3;
  SegmentBuilder *local_d0;
  AllocateResult allocation_1;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  SegmentBuilder *local_a8;
  AllocateResult allocation;
  WordCount amountPlusRef;
  word *ptr;
  Fault local_78;
  Fault f;
  SegmentBuilder **local_68;
  undefined1 local_60 [8];
  DebugComparison<capnp::_::SegmentBuilder_*&,_std::nullptr_t> _kjCondition;
  BuilderArena *orphanArena_local;
  Kind kind_local;
  SegmentWordCount amount_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder **segment_local;
  WirePointer **ref_local;
  
  _kjCondition._32_8_ = orphanArena;
  if (orphanArena == (BuilderArena *)0x0) {
    bVar2 = WirePointer::isNull(*ref);
    if (!bVar2) {
      zeroObject(*segment,capTable,*ref);
    }
    if ((amount == 0) && (kind == STRUCT)) {
      WirePointer::setKindAndTargetForEmptyStruct(*ref);
      ref_local = (WirePointer **)*ref;
    }
    else {
      local_68 = (SegmentBuilder **)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,segment);
      f.exception = (Exception *)0x0;
      kj::_::DebugExpression<capnp::_::SegmentBuilder*&>::operator!=
                ((DebugComparison<capnp::_::SegmentBuilder_*&,_std::nullptr_t> *)local_60,
                 (DebugExpression<capnp::_::SegmentBuilder*&> *)&local_68,&f.exception);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentBuilder*&,decltype(nullptr)>&>
                  (&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x1ee,FAILED,"segment != nullptr","_kjCondition,",
                   (DebugComparison<capnp::_::SegmentBuilder_*&,_std::nullptr_t> *)local_60);
        kj::_::Debug::Fault::fatal(&local_78);
      }
      ref_local = (WirePointer **)SegmentBuilder::allocate(*segment,amount);
      if ((word *)ref_local == (word *)0x0) {
        this = SegmentBuilder::getArena(*segment);
        amount_00 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                              (amount + 1,(anon_class_1_0_00000001 *)&_kjCondition_1);
        AVar3 = BuilderArena::allocate(this,amount_00);
        local_a8 = AVar3.segment;
        *segment = local_a8;
        allocation.segment = (SegmentBuilder *)AVar3.words;
        pWVar1 = *ref;
        pos = SegmentReader::getOffsetTo
                        (&(*segment)->super_SegmentReader,(word *)allocation.segment);
        WirePointer::setFar(pWVar1,false,pos);
        pWVar1 = *ref;
        si = SegmentReader::getSegmentId(&(*segment)->super_SegmentReader);
        WirePointer::FarRef::set(&(pWVar1->field_1).farRef,si);
        *ref = (WirePointer *)allocation.segment;
        WirePointer::setKindAndTarget
                  (*ref,kind,(word *)&((allocation.segment)->super_SegmentReader).id,*segment);
        ref_local = (WirePointer **)&((allocation.segment)->super_SegmentReader).id;
      }
      else {
        WirePointer::setKindAndTarget(*ref,kind,(word *)ref_local,*segment);
      }
    }
  }
  else {
    f_1.exception._6_1_ = WirePointer::isNull(*ref);
    f_1.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 6))
    ;
    bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f_1.exception + 7));
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&allocation_1.words,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x20e,FAILED,"ref->isNull()","_kjCondition,",
                 (DebugExpression<bool> *)((long)&f_1.exception + 7));
      kj::_::Debug::Fault::fatal((Fault *)&allocation_1.words);
    }
    AVar3 = BuilderArena::allocate((BuilderArena *)_kjCondition._32_8_,amount);
    local_d0 = AVar3.segment;
    *segment = local_d0;
    WirePointer::setKindForOrphan(*ref,kind);
    allocation_1.segment = (SegmentBuilder *)AVar3.words;
    ref_local = (WirePointer **)allocation_1.segment;
  }
  return (word *)ref_local;
}

Assistant:

static KJ_ALWAYS_INLINE(word* allocate(
      WirePointer*& ref, SegmentBuilder*& segment, CapTableBuilder* capTable,
      SegmentWordCount amount, WirePointer::Kind kind, BuilderArena* orphanArena)) {
    // Allocate space in the message for a new object, creating far pointers if necessary. The
    // space is guaranteed to be zero'd (because MessageBuilder implementations are required to
    // return zero'd memory).
    //
    // * `ref` starts out being a reference to the pointer which shall be assigned to point at the
    //   new object.  On return, `ref` points to a pointer which needs to be initialized with
    //   the object's type information.  Normally this is the same pointer, but it can change if
    //   a far pointer was allocated -- in this case, `ref` will end up pointing to the far
    //   pointer's tag.  Either way, `allocate()` takes care of making sure that the original
    //   pointer ends up leading to the new object.  On return, only the upper 32 bit of `*ref`
    //   need to be filled in by the caller.
    // * `segment` starts out pointing to the segment containing `ref`.  On return, it points to
    //   the segment containing the allocated object, which is usually the same segment but could
    //   be a different one if the original segment was out of space.
    // * `amount` is the number of words to allocate.
    // * `kind` is the kind of object to allocate.  It is used to initialize the pointer.  It
    //   cannot be `FAR` -- far pointers are allocated automatically as needed.
    // * `orphanArena` is usually null.  If it is non-null, then we're allocating an orphan object.
    //   In this case, `segment` starts out null; the allocation takes place in an arbitrary
    //   segment belonging to the arena.  `ref` will be initialized as a non-far pointer, but its
    //   target offset will be set to zero.

    if (orphanArena == nullptr) {
      if (!ref->isNull()) zeroObject(segment, capTable, ref);

      if (amount == ZERO * WORDS && kind == WirePointer::STRUCT) {
        // Note that the check for kind == WirePointer::STRUCT will hopefully cause this whole
        // branch to be optimized away from all the call sites that are allocating non-structs.
        ref->setKindAndTargetForEmptyStruct();
        return reinterpret_cast<word*>(ref);
      }

      KJ_ASSUME(segment != nullptr);
      word* ptr = segment->allocate(amount);

      if (ptr == nullptr) {

        // Need to allocate in a new segment.  We'll need to allocate an extra pointer worth of
        // space to act as the landing pad for a far pointer.

        WordCount amountPlusRef = amount + POINTER_SIZE_IN_WORDS;
        auto allocation = segment->getArena()->allocate(
            assertMaxBits<SEGMENT_WORD_COUNT_BITS>(amountPlusRef, []() {
              KJ_FAIL_REQUIRE("requested object size exceeds maximum segment size");
            }));
        segment = allocation.segment;
        ptr = allocation.words;

        // Set up the original pointer to be a far pointer to the new segment.
        ref->setFar(false, segment->getOffsetTo(ptr));
        ref->farRef.set(segment->getSegmentId());

        // Initialize the landing pad to indicate that the data immediately follows the pad.
        ref = reinterpret_cast<WirePointer*>(ptr);
        ref->setKindAndTarget(kind, ptr + POINTER_SIZE_IN_WORDS, segment);

        // Allocated space follows new pointer.
        return ptr + POINTER_SIZE_IN_WORDS;
      } else {
        ref->setKindAndTarget(kind, ptr, segment);
        return ptr;
      }
    } else {
      // orphanArena is non-null.  Allocate an orphan.
      KJ_DASSERT(ref->isNull());
      auto allocation = orphanArena->allocate(amount);
      segment = allocation.segment;
      ref->setKindForOrphan(kind);
      return allocation.words;
    }
  }